

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

bool __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryTransferChild
          (Impl *this,EntryImpl *entry,Type type,
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>
          *lastModified,Maybe<unsigned_long> *size,Directory *fromDirectory,PathPtr fromPath,
          TransferMode mode)

{
  Type type_00;
  PathPtr fromPath_00;
  size_t sVar1;
  Array<kj::ReadableDirectory::Entry> *this_00;
  bool bVar2;
  uint uVar3;
  Own<const_kj::File> *pOVar4;
  File *pFVar5;
  RefOrVoid<const_kj::File> pFVar6;
  unsigned_long *puVar7;
  Own<kj::File> *other;
  Own<const_kj::Directory> *pOVar8;
  InMemoryDirectory *pIVar9;
  Directory *pDVar10;
  Entry *pEVar11;
  RefOrVoid<const_kj::Directory> fromDirectory_00;
  size_t *this_01;
  EntryImpl *__y;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> *other_00;
  NullableValue<kj::String> *other_01;
  String *pSVar12;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel> *pAVar13;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_EntryImpl>_>::value,_pair<iterator,_bool>_>
  _Var14;
  Fault local_348;
  Fault f_5;
  Fault f_4;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel> local_320;
  SymlinkNode local_318;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  Maybe<kj::String> local_2e8;
  undefined1 local_2c8 [8];
  NullableValue<kj::String> content;
  Fault f_3;
  Fault f_2;
  Own<const_kj::Directory> local_288;
  _Base_ptr local_278;
  undefined1 local_270;
  pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl> local_268;
  undefined1 local_218 [8];
  StringPtr nameRef;
  undefined1 auStack_200 [7];
  bool _kj_shouldLog;
  size_t sStack_1f8;
  Maybe<unsigned_long> local_1f0;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_> local_1e0;
  ArrayPtr<const_char> local_1d0;
  undefined1 local_1c0 [8];
  Path filename;
  EntryImpl newEntry;
  Entry *subEntry;
  Entry *__end6;
  Entry *__begin6;
  Array<kj::ReadableDirectory::Entry> *local_138;
  Array<kj::ReadableDirectory::Entry> *__range6;
  Impl *cpim;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> copy_1;
  Maybe<kj::Own<const_kj::Directory>_> local_100;
  undefined1 local_f0 [8];
  OwnOwn<const_kj::Directory> subdir;
  Fault f_1;
  Fault local_d0;
  Fault f;
  Own<const_kj::File> local_b0;
  unsigned_long local_a0;
  undefined1 local_98 [8];
  Own<kj::File> copy;
  Maybe<kj::Own<const_kj::File>_> local_60;
  undefined1 local_50 [8];
  OwnOwn<const_kj::File> file;
  Directory *fromDirectory_local;
  Maybe<unsigned_long> *size_local;
  Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>
  *lastModified_local;
  Type type_local;
  EntryImpl *entry_local;
  Impl *this_local;
  
  pSVar12 = fromPath.parts.ptr;
  sVar1 = fromPath.parts.size_;
  file.value.ptr = (File *)fromDirectory;
  if (type == FILE) {
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
              (&local_60,fromDirectory,fromPath.parts.ptr,fromPath.parts.size_,2);
    kj::_::readMaybe<kj::File_const>((_ *)local_50,&local_60);
    Maybe<kj::Own<const_kj::File>_>::~Maybe(&local_60);
    pOVar4 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_50);
    if (pOVar4 == (Own<const_kj::File> *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&subdir.value.ptr,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x5f2,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      this_local._7_1_ = false;
      kj::_::Debug::Fault::~Fault((Fault *)&subdir.value.ptr);
    }
    else {
      if (mode == COPY) {
        newInMemoryFile((kj *)local_98,this->clock);
        pFVar5 = Own<kj::File>::operator->((Own<kj::File> *)local_98);
        pOVar4 = kj::_::OwnOwn<const_kj::File>::operator*((OwnOwn<const_kj::File> *)local_50);
        pFVar6 = Own<const_kj::File>::operator*(pOVar4);
        local_a0 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
        puVar7 = Maybe<unsigned_long>::orDefault(size,&local_a0);
        (*(pFVar5->super_ReadableFile).super_FsNode._vptr_FsNode[0xd])(pFVar5,0,pFVar6,0,*puVar7);
        other = mv<kj::Own<kj::File>>((Own<kj::File> *)local_98);
        Own<const_kj::File>::Own(&local_b0,other);
        EntryImpl::set(entry,&local_b0);
        Own<const_kj::File>::~Own(&local_b0);
        Own<kj::File>::~Own((Own<kj::File> *)local_98);
      }
      else {
        if (mode == MOVE) {
          f.exception._0_4_ = fromPath.parts.ptr._0_4_;
          f.exception._4_4_ = fromPath.parts.ptr._4_4_;
          uVar3 = (*((file.value.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0x16])
                            (file.value.ptr,fromPath.parts.ptr,fromPath.parts.size_);
          if ((uVar3 & 1) == 0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                      (&local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x5ea,FAILED,"fromDirectory.tryRemove(fromPath)",
                       "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                       &fromPath);
            this_local._7_1_ = false;
            kj::_::Debug::Fault::~Fault(&local_d0);
            goto LAB_00502f26;
          }
        }
        pOVar4 = kj::_::OwnOwn<const_kj::File>::operator*((OwnOwn<const_kj::File> *)local_50);
        pOVar4 = mv<kj::Own<kj::File_const>>(pOVar4);
        EntryImpl::set(entry,pOVar4);
      }
      this_local._7_1_ = true;
    }
LAB_00502f26:
    kj::_::OwnOwn<const_kj::File>::~OwnOwn((OwnOwn<const_kj::File> *)local_50);
    return this_local._7_1_;
  }
  if (type == DIRECTORY) {
    copy_1.ptr._0_4_ = fromPath.parts.ptr._0_4_;
    copy_1.ptr._4_4_ = fromPath.parts.ptr._4_4_;
    (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x11])
              (&local_100,fromDirectory,pSVar12,fromPath.parts.size_,2);
    kj::_::readMaybe<kj::Directory_const>((_ *)local_f0,&local_100);
    Maybe<kj::Own<const_kj::Directory>_>::~Maybe(&local_100);
    pOVar8 = kj::_::OwnOwn::operator_cast_to_Own_((OwnOwn *)local_f0);
    if (pOVar8 == (Own<const_kj::Directory> *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                ((Fault *)&content.field_1.value.content.disposer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x612,FAILED,(char *)0x0,
                 "\"source node deleted concurrently during transfer\", fromPath",
                 (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
      this_local._7_1_ = false;
      kj::_::Debug::Fault::~Fault((Fault *)&content.field_1.value.content.disposer);
    }
    else {
      if (mode == COPY) {
        atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                  ((kj *)&cpim,this->clock);
        pIVar9 = Own<kj::(anonymous_namespace)::InMemoryDirectory>::operator->
                           ((Own<kj::(anonymous_namespace)::InMemoryDirectory> *)&cpim);
        __range6 = (Array<kj::ReadableDirectory::Entry> *)
                   MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::getWithoutLock
                             (&pIVar9->impl);
        pOVar8 = kj::_::OwnOwn<const_kj::Directory>::operator->
                           ((OwnOwn<const_kj::Directory> *)local_f0);
        pDVar10 = Own<const_kj::Directory>::get(pOVar8);
        (*(pDVar10->super_ReadableDirectory).super_FsNode._vptr_FsNode[7])(&__begin6);
        local_138 = (Array<kj::ReadableDirectory::Entry> *)&__begin6;
        __end6 = Array<kj::ReadableDirectory::Entry>::begin(local_138);
        pEVar11 = Array<kj::ReadableDirectory::Entry>::end(local_138);
        for (; __end6 != pEVar11; __end6 = __end6 + 1) {
          pSVar12 = mv<kj::String>(&__end6->name);
          EntryImpl::EntryImpl((EntryImpl *)&filename.parts.disposer,pSVar12);
          StringPtr::StringPtr((StringPtr *)&local_1d0,(String *)&filename.parts.disposer);
          Path::Path((Path *)local_1c0,(StringPtr)local_1d0);
          this_00 = __range6;
          type_00 = __end6->type;
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>::Maybe
                    (&local_1e0,(void *)0x0);
          Maybe<unsigned_long>::Maybe(&local_1f0,(void *)0x0);
          pOVar8 = kj::_::OwnOwn<const_kj::Directory>::operator*
                             ((OwnOwn<const_kj::Directory> *)local_f0);
          fromDirectory_00 = Own<const_kj::Directory>::operator*(pOVar8);
          PathPtr::PathPtr((PathPtr *)auStack_200,(Path *)local_1c0);
          fromPath_00.parts.size_ = sStack_1f8;
          fromPath_00.parts.ptr = _auStack_200;
          bVar2 = tryTransferChild((Impl *)this_00,(EntryImpl *)&filename.parts.disposer,type_00,
                                   &local_1e0,&local_1f0,fromDirectory_00,fromPath_00,COPY);
          Maybe<unsigned_long>::~Maybe(&local_1f0);
          Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>::~Maybe
                    (&local_1e0);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            StringPtr::StringPtr((StringPtr *)local_218,(String *)&filename.parts.disposer);
            this_01 = &__range6->size_;
            __y = mv<kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                            ((EntryImpl *)&filename.parts.disposer);
            std::make_pair<kj::StringPtr&,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>
                      (&local_268,(StringPtr *)local_218,__y);
            _Var14 = std::
                     map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                     ::
                     insert<std::pair<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>
                               ((map<kj::StringPtr,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>>>
                                 *)this_01,&local_268);
            local_278 = (_Base_ptr)_Var14.first._M_node;
            local_270 = _Var14.second;
            std::pair<kj::StringPtr,_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl>::~pair
                      (&local_268);
          }
          else {
            nameRef.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
            while ((bool)nameRef.content.size_._7_1_ != false) {
              kj::_::Debug::log<char_const(&)[62],kj::Path&>
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                         ,0x601,ERROR,
                         "\"couldn\'t copy node of type not supported by InMemoryDirectory\", filename"
                         ,(char (*) [62])
                          "couldn\'t copy node of type not supported by InMemoryDirectory",
                         (Path *)local_1c0);
              nameRef.content.size_._7_1_ = false;
            }
          }
          Path::~Path((Path *)local_1c0);
          EntryImpl::~EntryImpl((EntryImpl *)&filename.parts.disposer);
        }
        Array<kj::ReadableDirectory::Entry>::~Array
                  ((Array<kj::ReadableDirectory::Entry> *)&__begin6);
        other_00 = mv<kj::Own<kj::(anonymous_namespace)::InMemoryDirectory>>
                             ((Own<kj::(anonymous_namespace)::InMemoryDirectory> *)&cpim);
        Own<kj::Directory_const>::Own<kj::(anonymous_namespace)::InMemoryDirectory,void>
                  ((Own<kj::Directory_const> *)&local_288,other_00);
        EntryImpl::set(entry,&local_288);
        Own<const_kj::Directory>::~Own(&local_288);
        Own<kj::(anonymous_namespace)::InMemoryDirectory>::~Own
                  ((Own<kj::(anonymous_namespace)::InMemoryDirectory> *)&cpim);
      }
      else {
        if (mode == MOVE) {
          uVar3 = (*((file.value.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0x16])
                            (file.value.ptr,fromPath.parts.ptr,fromPath.parts.size_);
          if ((uVar3 & 1) == 0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                      (&f_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                       ,0x60a,FAILED,"fromDirectory.tryRemove(fromPath)",
                       "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                       &fromPath);
            this_local._7_1_ = false;
            kj::_::Debug::Fault::~Fault(&f_3);
            goto LAB_005035ed;
          }
        }
        pOVar8 = kj::_::OwnOwn<const_kj::Directory>::operator*
                           ((OwnOwn<const_kj::Directory> *)local_f0);
        pOVar8 = mv<kj::Own<kj::Directory_const>>(pOVar8);
        EntryImpl::set(entry,pOVar8);
      }
      this_local._7_1_ = true;
    }
LAB_005035ed:
    kj::_::OwnOwn<const_kj::Directory>::~OwnOwn((OwnOwn<const_kj::Directory> *)local_f0);
    return this_local._7_1_;
  }
  if (type != SYMLINK) {
    return false;
  }
  local_2f8 = fromPath.parts.ptr._0_4_;
  uStack_2f4 = fromPath.parts.ptr._4_4_;
  uStack_2f0 = (undefined4)fromPath.parts.size_;
  uStack_2ec = fromPath.parts.size_._4_4_;
  (*(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xc])
            (&local_2e8,fromDirectory,pSVar12,sVar1);
  other_01 = kj::_::readMaybe<kj::String>(&local_2e8);
  kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_2c8,other_01);
  Maybe<kj::String>::~Maybe(&local_2e8);
  pSVar12 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_2c8);
  if (pSVar12 == (String *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
              (&local_348,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x621,FAILED,(char *)0x0,
               "\"source node deleted concurrently during transfer\", fromPath",
               (char (*) [49])"source node deleted concurrently during transfer",&fromPath);
    this_local._7_1_ = false;
    kj::_::Debug::Fault::~Fault(&local_348);
  }
  else {
    local_320.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)(*(code *)**(undefined8 **)this->clock)();
    pAVar13 = Maybe<kj::Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::DateLabel>_>::
              orDefault(lastModified,&local_320);
    local_318.lastModified.value.value =
         (Quantity<long,_kj::_::NanosecondLabel>)(pAVar13->value).value;
    pSVar12 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_2c8);
    pSVar12 = mv<kj::String>(pSVar12);
    String::String(&local_318.content,pSVar12);
    EntryImpl::init(entry,(EVP_PKEY_CTX *)&local_318);
    SymlinkNode::~SymlinkNode(&local_318);
    if (mode == MOVE) {
      uVar3 = (*((file.value.ptr)->super_ReadableFile).super_FsNode._vptr_FsNode[0x16])
                        (file.value.ptr,fromPath.parts.ptr,fromPath.parts.size_);
      if ((uVar3 & 1) == 0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19],kj::PathPtr&>
                  (&f_5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x61b,FAILED,"fromDirectory.tryRemove(fromPath)",
                   "\"couldn\'t move node\", fromPath",(char (*) [19])"couldn\'t move node",
                   &fromPath);
        this_local._7_1_ = false;
        kj::_::Debug::Fault::~Fault(&f_5);
        goto LAB_005038bd;
      }
    }
    this_local._7_1_ = true;
  }
LAB_005038bd:
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_2c8);
  return this_local._7_1_;
}

Assistant:

bool tryTransferChild(EntryImpl& entry, const FsNode::Type type, kj::Maybe<Date> lastModified,
                          kj::Maybe<uint64_t> size, const Directory& fromDirectory,
                          PathPtr fromPath, TransferMode mode) {
      switch (type) {
        case FsNode::Type::FILE:
          KJ_IF_MAYBE(file, fromDirectory.tryOpenFile(fromPath, WriteMode::MODIFY)) {
            if (mode == TransferMode::COPY) {
              auto copy = newInMemoryFile(clock);
              copy->copy(0, **file, 0, size.orDefault(kj::maxValue));
              entry.set(kj::mv(copy));
            } else {
              if (mode == TransferMode::MOVE) {
                KJ_ASSERT(fromDirectory.tryRemove(fromPath), "couldn't move node", fromPath) {
                  return false;
                }
              }
              entry.set(kj::mv(*file));
            }
            return true;
          } else {
            KJ_FAIL_ASSERT("source node deleted concurrently during transfer", fromPath) {
              return false;
            }
          }